

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O2

ts_nsec timed_fdb_iterator_next(fdb_iterator *it)

{
  fdb_status fVar1;
  ts_nsec tVar2;
  ts_nsec tVar3;
  long lVar4;
  long lVar5;
  
  tVar2 = get_monotonic_ts();
  fVar1 = fdb_iterator_next(it);
  tVar3 = get_monotonic_ts();
  lVar5 = 0xffffffff;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    lVar4 = tVar3 - tVar2;
    lVar5 = lVar4 + 1000000000;
    if (-1 < lVar4) {
      lVar5 = lVar4;
    }
    lVar5 = lVar5 / 1000;
  }
  return lVar5;
}

Assistant:

ts_nsec timed_fdb_iterator_next(fdb_iterator *it){

    ts_nsec start, end;
    fdb_status status;

    start = get_monotonic_ts();
    status = fdb_iterator_next(it);
    end = get_monotonic_ts();

    if(status == FDB_RESULT_SUCCESS){
      return ts_diff(start, end);
    } else {
      return ERR_NS;
    }

}